

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::GenVec<float,_4>::doApply
          (IRet *__return_storage_ptr__,GenVec<float,_4> *this,EvalContext *param_1,IArgs *iargs)

{
  bool *pbVar1;
  Interval *pIVar2;
  Interval *pIVar3;
  Interval *pIVar4;
  Interval *pIVar5;
  double dVar6;
  undefined7 uVar7;
  long lVar8;
  
  pIVar2 = iargs->a;
  pIVar3 = iargs->b;
  pIVar4 = iargs->c;
  pIVar5 = iargs->d;
  lVar8 = 8;
  do {
    *(undefined1 *)((long)__return_storage_ptr__->m_data + lVar8 + -8) = 0;
    pbVar1 = &__return_storage_ptr__->m_data[0].m_hasNaN + lVar8;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar8 = lVar8 + 0x18;
  } while (lVar8 != 0x68);
  __return_storage_ptr__->m_data[0].m_hi = pIVar2->m_hi;
  uVar7 = *(undefined7 *)&pIVar2->field_0x1;
  dVar6 = pIVar2->m_lo;
  __return_storage_ptr__->m_data[0].m_hasNaN = pIVar2->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[0].field_0x1 = uVar7;
  __return_storage_ptr__->m_data[0].m_lo = dVar6;
  __return_storage_ptr__->m_data[1].m_hi = pIVar3->m_hi;
  uVar7 = *(undefined7 *)&pIVar3->field_0x1;
  dVar6 = pIVar3->m_lo;
  __return_storage_ptr__->m_data[1].m_hasNaN = pIVar3->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[1].field_0x1 = uVar7;
  __return_storage_ptr__->m_data[1].m_lo = dVar6;
  uVar7 = *(undefined7 *)&pIVar4->field_0x1;
  dVar6 = pIVar4->m_lo;
  __return_storage_ptr__->m_data[2].m_hasNaN = pIVar4->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[2].field_0x1 = uVar7;
  __return_storage_ptr__->m_data[2].m_lo = dVar6;
  __return_storage_ptr__->m_data[2].m_hi = pIVar4->m_hi;
  uVar7 = *(undefined7 *)&pIVar5->field_0x1;
  dVar6 = pIVar5->m_lo;
  __return_storage_ptr__->m_data[3].m_hasNaN = pIVar5->m_hasNaN;
  *(undefined7 *)&__return_storage_ptr__->m_data[3].field_0x1 = uVar7;
  __return_storage_ptr__->m_data[3].m_lo = dVar6;
  __return_storage_ptr__->m_data[3].m_hi = pIVar5->m_hi;
  return __return_storage_ptr__;
}

Assistant:

IRet		doApply		(const EvalContext&, const IArgs& iargs) const
	{
		return IRet(iargs.a, iargs.b, iargs.c, iargs.d);
	}